

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O0

void __thiscall
psy::C::DeclarationBinder::bindAnonymousFieldDeclaration(DeclarationBinder *this,SyntaxNode *node)

{
  Symbol *this_00;
  bool bVar1;
  SymbolKind SVar2;
  int iVar3;
  reference ppDVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  MemberDeclarationSymbol *memb;
  Identifier *name;
  FieldDeclarationSymbol *fldDecl;
  TagDeclarationSymbol *tagTyDecl;
  value_type decl;
  SyntaxNode *node_local;
  DeclarationBinder *this_local;
  
  bVar1 = std::
          stack<psy::C::DeclarationSymbol_*,_std::deque<psy::C::DeclarationSymbol_*,_std::allocator<psy::C::DeclarationSymbol_*>_>_>
          ::empty(&this->decls_);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x95);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"<empty message>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    ppDVar4 = std::
              stack<psy::C::DeclarationSymbol_*,_std::deque<psy::C::DeclarationSymbol_*,_std::allocator<psy::C::DeclarationSymbol_*>_>_>
              ::top(&this->decls_);
    if (*ppDVar4 == (value_type)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x95);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,"<empty message>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      ppDVar4 = std::
                stack<psy::C::DeclarationSymbol_*,_std::deque<psy::C::DeclarationSymbol_*,_std::allocator<psy::C::DeclarationSymbol_*>_>_>
                ::top(&this->decls_);
      this_00 = &(*ppDVar4)->super_Symbol;
      SVar2 = Symbol::kind(this_00);
      if ((SVar2 != UnionDeclaration) && (SVar2 = Symbol::kind(this_00), SVar2 != StructDeclaration)
         ) {
        poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x98);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,"<empty message>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        return;
      }
      iVar3 = (*this_00->_vptr_Symbol[0x18])();
      memb = &bindDeclaration<psy::C::FieldDeclarationSymbol>(this,node)->
              super_MemberDeclarationSymbol;
      TagDeclarationSymbol::addMember((TagDeclarationSymbol *)CONCAT44(extraout_var,iVar3),memb);
      name = SyntaxTree::findIdentifier((this->super_SyntaxVisitor).tree_,"",0);
      nameDeclarationAtTop(this,name);
    }
  }
  return;
}

Assistant:

DECL_AT_TOP(auto decl, );
    PSY_ASSERT_2(decl->kind() == SymbolKind::UnionDeclaration
                     || decl->kind() == SymbolKind::StructDeclaration,
                 return);
    auto tagTyDecl = decl->asTagTypeDeclaration();
    auto fldDecl = bindDeclaration<FieldDeclarationSymbol>(node);
    tagTyDecl->addMember(fldDecl);
    nameDeclarationAtTop(tree_->findIdentifier("", 0));
}

SyntaxVisitor::Action DeclarationBinder::visitFieldDeclaration_AtDeclarators(
        const FieldDeclarationSyntax* node)
{
    if (!node->declarators()) {
        TY_AT_TOP(auto ty, Action::Quit);
        PSY_ASSERT_2(ty->kind() == TypeKind::Tag, return Action::Quit);
        auto tagTy = ty->asTagType();
        if (tagTy->isUntagged()) {
            bindAnonymousFieldDeclaration(node);
            typeDeclarationAtTopWithTypeAtTop();
            popTypesUntilNonDerivedDeclaratorType();
            finishDeclaration();
            return visitFieldDeclaration_AtEnd(node);
        }
    }

    return visit_AtMultipleDeclarators_COMMON(
                node,
                &DeclarationBinder::visitFieldDeclaration_AtEnd);
}